

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoarimatest3.c
# Opt level: O1

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *pdVar5;
  double *pdVar6;
  double *newxreg;
  auto_arima_object obj;
  ulong uVar7;
  int iVar8;
  uint N;
  undefined1 *puVar9;
  long lVar10;
  undefined4 uVar11;
  undefined1 local_70e8 [8];
  double temp [1200];
  double temp1 [1200];
  double temp2 [1200];
  int order [3];
  int seasonal [3];
  
  temp2[0x4af] = 4.24399158440087e-314;
  order[0] = 5;
  order[1] = 2;
  order[2] = 1;
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/e1m.dat","r");
  if (__stream != (FILE *)0x0) {
    iVar4 = feof(__stream);
    iVar8 = 0;
    if (iVar4 == 0) {
      pdVar5 = temp1 + 0x4af;
      pdVar6 = temp + 0x4af;
      puVar9 = local_70e8;
      iVar8 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf %lf %lf \n",puVar9,pdVar6,pdVar5);
        iVar4 = feof(__stream);
        pdVar5 = pdVar5 + 1;
        pdVar6 = pdVar6 + 1;
        puVar9 = puVar9 + 8;
        iVar8 = iVar8 + 1;
      } while (iVar4 == 0);
    }
    lVar10 = (long)iVar8;
    N = iVar8 - 5;
    pdVar5 = (double *)malloc(lVar10 * 8 - 0x28);
    pdVar6 = (double *)malloc((lVar10 + -5) * 0x10);
    newxreg = (double *)malloc(0x50);
    if (5 < iVar8) {
      memcpy(pdVar5,local_70e8,(ulong)N * 8);
      uVar7 = 0;
      do {
        pdVar6[uVar7] = temp[uVar7 + 0x4af];
        pdVar6[(long)(int)N + uVar7] = temp1[uVar7 + 0x4af];
        uVar7 = uVar7 + 1;
      } while (N != uVar7);
    }
    newxreg[4] = temp[lVar10 + 0x4ae];
    dVar1 = temp[lVar10 + 0x4aa];
    dVar2 = temp[lVar10 + 0x4ab];
    dVar3 = temp[lVar10 + 0x4ad];
    newxreg[2] = temp[lVar10 + 0x4ac];
    newxreg[3] = dVar3;
    *newxreg = dVar1;
    newxreg[1] = dVar2;
    dVar1 = temp1[lVar10 + 0x4ab];
    dVar2 = temp1[lVar10 + 0x4ac];
    dVar3 = temp1[lVar10 + 0x4ad];
    newxreg[5] = temp1[lVar10 + 0x4aa];
    newxreg[6] = dVar1;
    newxreg[7] = dVar2;
    newxreg[8] = dVar3;
    newxreg[9] = temp1[lVar10 + 0x4ae];
    lVar10 = 0;
    obj = auto_arima_init((int *)(temp2 + 0x4af),order + 1,0,2,N);
    auto_arima_setApproximation(obj,1);
    auto_arima_setStepwise(obj,1);
    auto_arima_setVerbose(obj,1);
    auto_arima_exec(obj,pdVar5,pdVar6);
    auto_arima_summary(obj);
    auto_arima_predict(obj,pdVar5,pdVar6,5,newxreg,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",SUB84(xpred[lVar10],0));
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    putchar(10);
    lVar10 = 0;
    printf("Standard Errors  : ");
    do {
      dVar1 = amse[lVar10];
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
        uVar11 = SUB84(dVar1,0);
      }
      else {
        uVar11 = SUB84(SQRT(dVar1),0);
      }
      printf("%g ",uVar11);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    putchar(10);
    auto_arima_free(obj);
    free(pdVar5);
    free(xpred);
    free(amse);
    free(pdVar6);
    free(newxreg);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
    int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	P = 2;
	D = 1;
	Q = 2;
	
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};

    s = 0;
    r = 2;
	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/e1m.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);


	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        xreg[i] = temp1[i];
		xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,1);
	auto_arima_setStepwise(obj,1);
	auto_arima_setVerbose(obj,1);

	auto_arima_exec(obj,inp,xreg);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, xreg, L,newxreg, xpred, amse);

	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);

    return 0;
}